

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O2

int pkey_gost_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  byte bVar6;
  
  bVar6 = 0;
  iVar1 = pkey_gost_init(dst);
  iVar5 = 0;
  if (iVar1 != 0) {
    puVar2 = (undefined8 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)src);
    puVar3 = (undefined8 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)dst);
    if (puVar3 != (undefined8 *)0x0 && puVar2 != (undefined8 *)0x0) {
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar3 = *puVar2;
        puVar2 = puVar2 + (ulong)bVar6 * -2 + 1;
        puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      }
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int pkey_gost_copy(EVP_PKEY_CTX *dst, ossl3_const EVP_PKEY_CTX *src)
{
    struct gost_pmeth_data *dst_data, *src_data;
    if (!pkey_gost_init(dst)) {
        return 0;
    }
    src_data = EVP_PKEY_CTX_get_data(src);
    dst_data = EVP_PKEY_CTX_get_data(dst);
    if (!src_data || !dst_data)
        return 0;

    *dst_data = *src_data;

    return 1;
}